

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_EmptyBuilder::_Run(_Test_EmptyBuilder *this)

{
  bool bVar1;
  Slice *value;
  Slice block;
  FilterBlockReader reader;
  Slice local_250;
  Tester local_240;
  FilterBlockBuilder builder;
  
  FilterBlockBuilder::FilterBlockBuilder(&builder,(FilterPolicy *)this);
  block = FilterBlockBuilder::Finish(&builder);
  test::Tester::Tester
            (&local_240,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/filter_block_test.cc"
             ,0x2f);
  EscapeString_abi_cxx11_((string *)&reader,(leveldb *)&block,value);
  test::Tester::IsEq<char[21],std::__cxx11::string>
            (&local_240,(char (*) [21])"\\x00\\x00\\x00\\x00\\x0b",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader);
  std::__cxx11::string::~string((string *)&reader);
  test::Tester::~Tester(&local_240);
  FilterBlockReader::FilterBlockReader(&reader,(FilterPolicy *)this,&block);
  test::Tester::Tester
            (&local_240,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/filter_block_test.cc"
             ,0x31);
  local_250.data_ = "foo";
  local_250.size_ = 3;
  bVar1 = FilterBlockReader::KeyMayMatch(&reader,0,&local_250);
  test::Tester::Is(&local_240,bVar1,"reader.KeyMayMatch(0, \"foo\")");
  test::Tester::~Tester(&local_240);
  test::Tester::Tester
            (&local_240,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/filter_block_test.cc"
             ,0x32);
  local_250.data_ = "foo";
  local_250.size_ = 3;
  bVar1 = FilterBlockReader::KeyMayMatch(&reader,100000,&local_250);
  test::Tester::Is(&local_240,bVar1,"reader.KeyMayMatch(100000, \"foo\")");
  test::Tester::~Tester(&local_240);
  FilterBlockBuilder::~FilterBlockBuilder(&builder);
  return;
}

Assistant:

TEST(FilterBlockTest, EmptyBuilder) {
  FilterBlockBuilder builder(&policy_);
  Slice block = builder.Finish();
  ASSERT_EQ("\\x00\\x00\\x00\\x00\\x0b", EscapeString(block));
  FilterBlockReader reader(&policy_, block);
  ASSERT_TRUE(reader.KeyMayMatch(0, "foo"));
  ASSERT_TRUE(reader.KeyMayMatch(100000, "foo"));
}